

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute_impl.h
# Opt level: O0

void __thiscall
c74::min::
attribute<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)2>::
attribute<std::vector<c74::min::atom,std::allocator<c74::min::atom>>>
          (attribute<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)2>
           *this,object_base *an_owner,string *a_name,double a_default_value,
          vector<c74::min::atom,_std::allocator<c74::min::atom>_> *args)

{
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*>_>_>
  *this_00;
  mapped_type *ppaVar2;
  undefined1 local_58 [8];
  atoms as;
  vector<c74::min::atom,_std::allocator<c74::min::atom>_> *args_local;
  double a_default_value_local;
  string *a_name_local;
  object_base *an_owner_local;
  attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)2>
  *this_local;
  
  args_local = (vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)a_default_value;
  a_default_value_local = (double)a_name;
  a_name_local = (string *)an_owner;
  an_owner_local = (object_base *)this;
  attribute_base::attribute_base((attribute_base *)this,an_owner,a_name);
  *(undefined ***)this = &PTR_operator__00289e18;
  Catch::clara::std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::vector
            ((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)(this + 200));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(this + 0xe0));
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(this + 0xf8));
  attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)2>
  ::attribute_threadsafe_helper
            ((attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)2>
              *)(this + 0x110),
             (attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)2>
              *)this);
  this_00 = object_base::attributes_abi_cxx11_(*(object_base **)(this + 8));
  ppaVar2 = Catch::clara::std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_c74::min::attribute_base_*>_>_>
            ::operator[](this_00,a_name);
  *ppaVar2 = (mapped_type)this;
  *(undefined8 *)(this + 0x20) = k_sym_float64;
  bVar1 = std::operator==(a_name,"fontname");
  if (bVar1) {
    *(undefined4 *)(this + 0x98) = 6;
  }
  else {
    *(undefined4 *)(this + 0x98) = 0;
  }
  handle_arguments<std::vector<c74::min::atom,std::allocator<c74::min::atom>>>(this,args);
  attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)2>
  ::copy_range((attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)2>
                *)this);
  *(vector<c74::min::atom,_std::allocator<c74::min::atom>_> **)(this + 0xc0) = args_local;
  to_atoms<double,_0>((atoms *)local_58,(double *)&args_local);
  (**(code **)(*(long *)this + 8))(this,local_58,0,1);
  std::vector<c74::min::atom,_std::allocator<c74::min::atom>_>::~vector
            ((vector<c74::min::atom,_std::allocator<c74::min::atom>_> *)local_58);
  return;
}

Assistant:

attribute<T, threadsafety, limit_type, repetitions>::attribute(object_base* an_owner, const std::string a_name, const T a_default_value, ARGS... args)
    : attribute_base{ *an_owner, a_name }
{
    m_owner.attributes()[a_name] = this;

    if (is_same<T, bool>::value) {
        m_datatype = k_sym_long;
    }
    else if (is_same<T, int>::value) {
        m_datatype = k_sym_long;
    }
    else if (is_enum<T>::value) {
        m_datatype = k_sym_long;
    }
    else if (is_same<T, symbol>::value) {
        m_datatype = k_sym_symbol;
    }
    else if (is_same<T, float>::value) {
        m_datatype = k_sym_float32;
    }
    else {
        m_datatype = k_sym_float64;
    }

    if (is_same<T, bool>::value) {
        m_style = style::onoff;
    }
    else if (is_enum<T>::value) {
        m_style = style::enum_index;
    }
    else if (is_same<T, ui::color>::value) {
        m_style = style::color;
    }
    else if (a_name == "fontname") {
        m_style = style::font;
    }
    else {
        m_style = style::none;
    }

    handle_arguments(args...);
    copy_range();

    m_default = a_default_value;

    if (is_same<T, ui::color>::value && an_owner->is_ui_class()) {
        auto ui_op = dynamic_cast<ui_operator_base*>(an_owner);
        ui_op->add_color_attribute({ a_name, this });
    }

    auto as = to_atoms(a_default_value);
    set(as, false, true);
}